

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::sadd_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  bool bVar2;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  APInt AVar4;
  APInt local_40;
  
  APInt(&local_40,RHS);
  operator+((llvm *)this,&local_40,(APInt *)Overflow);
  ~APInt(&local_40);
  bVar1 = isNonNegative(RHS);
  bVar2 = isNonNegative((APInt *)Overflow);
  if (bVar1 == bVar2) {
    bVar1 = isNonNegative(this);
    bVar2 = isNonNegative(RHS);
    bVar1 = bVar2 != bVar1;
    uVar3 = extraout_RDX_00;
  }
  else {
    bVar1 = false;
    uVar3 = extraout_RDX;
  }
  *(bool *)in_RCX = bVar1;
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::sadd_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this+RHS;
  Overflow = isNonNegative() == RHS.isNonNegative() &&
             Res.isNonNegative() != isNonNegative();
  return Res;
}